

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn.c
# Opt level: O3

void ym2612_update_one(void *chip,UINT32 length,DEV_SMPL **buffer)

{
  FM_OPN *OPN;
  FM_CH *CH;
  FM_CH *CH_00;
  FM_CH *CH_01;
  FM_CH *CH_02;
  FM_CH *CH_03;
  FM_CH *CH_04;
  undefined1 (*pauVar1) [16];
  byte *pbVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  UINT8 UVar7;
  byte bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int chnum;
  int chnum_00;
  int chnum_01;
  int chnum_02;
  int chnum_03;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  ulong extraout_RDX;
  ulong uVar15;
  ulong extraout_RDX_00;
  UINT8 UVar16;
  byte bVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  FM_SLOT *SLOT;
  DEV_SMPL *local_78;
  DEV_SMPL *local_70;
  
  iVar4 = 0;
  if (buffer == (DEV_SMPL **)0x0) {
    local_70 = (DEV_SMPL *)0x0;
    local_78 = (DEV_SMPL *)0x0;
  }
  else {
    local_78 = *buffer;
    local_70 = buffer[1];
  }
  OPN = (FM_OPN *)((long)chip + 0x208);
  CH = (FM_CH *)((long)chip + 0x4778);
  CH_00 = (FM_CH *)((long)chip + 0x4910);
  if (*(char *)((long)chip + 0x5110) == '\0') {
    iVar4 = *(int *)((long)chip + 0x510c) << 5;
  }
  CH_01 = (FM_CH *)((long)chip + 0x4aa8);
  CH_02 = (FM_CH *)((long)chip + 0x4c40);
  CH_03 = (FM_CH *)((long)chip + 0x4dd8);
  CH_04 = (FM_CH *)((long)chip + 0x4f70);
  refresh_fc_eg_chan(OPN,CH);
  refresh_fc_eg_chan(OPN,CH_00);
  if ((*(byte *)((long)chip + 0x230) & 0xc0) == 0) {
    refresh_fc_eg_chan(OPN,CH_01);
  }
  else if (*(int *)((long)chip + 0x4ad0) == -1) {
    iVar9 = *(int *)(*(long *)((long)chip + 0x4aa8) + (ulong)*(byte *)((long)chip + 0x68e) * 4) +
            *(int *)((long)chip + 0x684);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4ad0) = (uint)(iVar9 * *(int *)((long)chip + 0x4ac8)) >> 1;
    bVar8 = *(byte *)((long)chip + 0x68e) >> (*(byte *)((long)chip + 0x4ab0) & 0x1f);
    uVar5 = (uint)bVar8;
    if (uVar5 != *(byte *)((long)chip + 0x4ac4)) {
      *(byte *)((long)chip + 0x4ac4) = bVar8;
      uVar11 = *(int *)((long)chip + 0x4ab4) + uVar5;
      if (uVar11 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar11];
        UVar16 = eg_rate_select[uVar11];
      }
      else {
        UVar16 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4ae8) = UVar7;
      *(UINT8 *)((long)chip + 0x4ae9) = UVar16;
      uVar11 = *(int *)((long)chip + 0x4ab8) + uVar5;
      *(UINT8 *)((long)chip + 0x4aea) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4aeb) = eg_rate_select[uVar11];
      uVar11 = *(int *)((long)chip + 0x4abc) + uVar5;
      *(UINT8 *)((long)chip + 0x4aec) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4aed) = eg_rate_select[uVar11];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4ac0);
      *(UINT8 *)((long)chip + 0x4aee) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4aef) = eg_rate_select[uVar5];
    }
    iVar9 = *(int *)(*(long *)((long)chip + 0x4b48) + (ulong)*(byte *)((long)chip + 0x68f) * 4) +
            *(int *)((long)chip + 0x688);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4b70) = (uint)(iVar9 * *(int *)((long)chip + 0x4b68)) >> 1;
    bVar8 = *(byte *)((long)chip + 0x68f) >> (*(byte *)((long)chip + 0x4b50) & 0x1f);
    uVar5 = (uint)bVar8;
    if (uVar5 != *(byte *)((long)chip + 0x4b64)) {
      *(byte *)((long)chip + 0x4b64) = bVar8;
      uVar11 = *(int *)((long)chip + 0x4b54) + uVar5;
      if (uVar11 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar11];
        UVar16 = eg_rate_select[uVar11];
      }
      else {
        UVar16 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4b88) = UVar7;
      *(UINT8 *)((long)chip + 0x4b89) = UVar16;
      uVar11 = *(int *)((long)chip + 0x4b58) + uVar5;
      *(UINT8 *)((long)chip + 0x4b8a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4b8b) = eg_rate_select[uVar11];
      uVar11 = *(int *)((long)chip + 0x4b5c) + uVar5;
      *(UINT8 *)((long)chip + 0x4b8c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4b8d) = eg_rate_select[uVar11];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4b60);
      *(UINT8 *)((long)chip + 0x4b8e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4b8f) = eg_rate_select[uVar5];
    }
    iVar9 = *(int *)(*(long *)((long)chip + 0x4af8) + (ulong)*(byte *)((long)chip + 0x68d) * 4) +
            *(int *)((long)chip + 0x680);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4b20) = (uint)(iVar9 * *(int *)((long)chip + 0x4b18)) >> 1;
    bVar8 = *(byte *)((long)chip + 0x68d) >> (*(byte *)((long)chip + 0x4b00) & 0x1f);
    uVar5 = (uint)bVar8;
    if (uVar5 != *(byte *)((long)chip + 0x4b14)) {
      *(byte *)((long)chip + 0x4b14) = bVar8;
      uVar11 = *(int *)((long)chip + 0x4b04) + uVar5;
      if (uVar11 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar11];
        UVar16 = eg_rate_select[uVar11];
      }
      else {
        UVar16 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4b38) = UVar7;
      *(UINT8 *)((long)chip + 0x4b39) = UVar16;
      uVar11 = *(int *)((long)chip + 0x4b08) + uVar5;
      *(UINT8 *)((long)chip + 0x4b3a) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4b3b) = eg_rate_select[uVar11];
      uVar11 = *(int *)((long)chip + 0x4b0c) + uVar5;
      *(UINT8 *)((long)chip + 0x4b3c) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4b3d) = eg_rate_select[uVar11];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4b10);
      *(UINT8 *)((long)chip + 0x4b3e) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4b3f) = eg_rate_select[uVar5];
    }
    iVar9 = *(int *)(*(long *)((long)chip + 0x4b98) + (ulong)*(byte *)((long)chip + 0x4c30) * 4) +
            *(int *)((long)chip + 0x4c2c);
    if (iVar9 < 0) {
      iVar9 = iVar9 + *(int *)((long)chip + 0x46e8);
    }
    *(uint *)((long)chip + 0x4bc0) = (uint)(iVar9 * *(int *)((long)chip + 0x4bb8)) >> 1;
    bVar8 = *(byte *)((long)chip + 0x4c30) >> (*(byte *)((long)chip + 0x4ba0) & 0x1f);
    uVar5 = (uint)bVar8;
    if (uVar5 != *(byte *)((long)chip + 0x4bb4)) {
      *(byte *)((long)chip + 0x4bb4) = bVar8;
      uVar11 = *(int *)((long)chip + 0x4ba4) + uVar5;
      if (uVar11 < 0x5e) {
        UVar7 = "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
                [uVar11];
        UVar16 = eg_rate_select[uVar11];
      }
      else {
        UVar16 = 0x90;
        UVar7 = '\0';
      }
      *(UINT8 *)((long)chip + 0x4bd8) = UVar7;
      *(UINT8 *)((long)chip + 0x4bd9) = UVar16;
      uVar11 = *(int *)((long)chip + 0x4ba8) + uVar5;
      *(UINT8 *)((long)chip + 0x4bda) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4bdb) = eg_rate_select[uVar11];
      uVar11 = *(int *)((long)chip + 0x4bac) + uVar5;
      *(UINT8 *)((long)chip + 0x4bdc) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar11];
      *(UINT8 *)((long)chip + 0x4bdd) = eg_rate_select[uVar11];
      uVar5 = uVar5 + *(int *)((long)chip + 0x4bb0);
      *(UINT8 *)((long)chip + 0x4bde) =
           "\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\v\n\n\n\n\t\t\t\t\b\b\b\b\a\a\a\a\x06\x06\x06\x06\x05\x05\x05\x05\x04\x04\x04\x04\x03\x03\x03\x03\x02\x02\x02\x02\x01\x01\x01\x01"
           [uVar5];
      *(UINT8 *)((long)chip + 0x4bdf) = eg_rate_select[uVar5];
    }
  }
  refresh_fc_eg_chan(OPN,CH_02);
  refresh_fc_eg_chan(OPN,CH_03);
  refresh_fc_eg_chan(OPN,CH_04);
  if (length == 0) {
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x47c0);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x47ac), 0x1ff < (int)uVar5)) &&
         (bVar17 = *(byte *)((long)chip + lVar6 + 0x47a4), 1 < bVar17)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x479c) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x47c1);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar17 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4794) + *(int *)((long)chip + lVar6 + 0x4784)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x47a4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x47ac) = 0;
              *(byte *)((long)chip + lVar6 + 0x47a4) =
                   *(int *)((long)chip + lVar6 + 0x47b0) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x47c1) = 4;
          }
          if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x47c1) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x47ac) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar11 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x47c1) == (bVar8 & 4)) {
          uVar11 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x47b4) = uVar11 + *(int *)((long)chip + lVar6 + 0x47a8);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4958);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4944), 0x1ff < (int)uVar5)) &&
         (bVar17 = *(byte *)((long)chip + lVar6 + 0x493c), 1 < bVar17)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4934) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4959);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar17 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x492c) + *(int *)((long)chip + lVar6 + 0x491c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x493c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4944) = 0;
              *(byte *)((long)chip + lVar6 + 0x493c) =
                   *(int *)((long)chip + lVar6 + 0x4948) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4959) = 4;
          }
          if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4959) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4944) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar11 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4959) == (bVar8 & 4)) {
          uVar11 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x494c) = uVar11 + *(int *)((long)chip + lVar6 + 0x4940);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4af0);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4adc), 0x1ff < (int)uVar5)) &&
         (bVar17 = *(byte *)((long)chip + lVar6 + 0x4ad4), 1 < bVar17)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4acc) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4af1);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar17 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4ac4) + *(int *)((long)chip + lVar6 + 0x4ab4)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4ad4) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4adc) = 0;
              *(byte *)((long)chip + lVar6 + 0x4ad4) =
                   *(int *)((long)chip + lVar6 + 0x4ae0) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4af1) = 4;
          }
          if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4af1) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4adc) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar11 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4af1) == (bVar8 & 4)) {
          uVar11 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4ae4) = uVar11 + *(int *)((long)chip + lVar6 + 0x4ad8);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4c88);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4c74), 0x1ff < (int)uVar5)) &&
         (bVar17 = *(byte *)((long)chip + lVar6 + 0x4c6c), 1 < bVar17)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4c64) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4c89);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar17 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4c5c) + *(int *)((long)chip + lVar6 + 0x4c4c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4c6c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4c74) = 0;
              *(byte *)((long)chip + lVar6 + 0x4c6c) =
                   *(int *)((long)chip + lVar6 + 0x4c78) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4c89) = 4;
          }
          if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4c89) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4c74) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar11 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4c89) == (bVar8 & 4)) {
          uVar11 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4c7c) = uVar11 + *(int *)((long)chip + lVar6 + 0x4c70);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 20000);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4e0c), 0x1ff < (int)uVar5)) &&
         (bVar17 = *(byte *)((long)chip + lVar6 + 0x4e04), 1 < bVar17)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4dfc) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4e21);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar17 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4df4) + *(int *)((long)chip + lVar6 + 0x4de4)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4e04) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4e0c) = 0;
              *(byte *)((long)chip + lVar6 + 0x4e04) =
                   *(int *)((long)chip + lVar6 + 0x4e10) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4e21) = 4;
          }
          if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4e21) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4e0c) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar11 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4e21) == (bVar8 & 4)) {
          uVar11 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4e14) = uVar11 + *(int *)((long)chip + lVar6 + 0x4e08);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
    lVar6 = 0;
    do {
      bVar8 = *(byte *)((long)chip + lVar6 + 0x4fb8);
      if ((((bVar8 & 8) != 0) &&
          (uVar5 = *(uint *)((long)chip + lVar6 + 0x4fa4), 0x1ff < (int)uVar5)) &&
         (bVar17 = *(byte *)((long)chip + lVar6 + 0x4f9c), 1 < bVar17)) {
        if ((bVar8 & 1) == 0) {
          if ((bVar8 & 2) == 0) {
            *(undefined4 *)((long)chip + lVar6 + 0x4f94) = 0;
          }
          else {
            pbVar2 = (byte *)((long)chip + lVar6 + 0x4fb9);
            *pbVar2 = *pbVar2 ^ 4;
          }
          if (bVar17 != 4) {
            if ((uint)*(byte *)((long)chip + lVar6 + 0x4f8c) + *(int *)((long)chip + lVar6 + 0x4f7c)
                < 0x5e) {
              *(undefined1 *)((long)chip + lVar6 + 0x4f9c) = 4;
            }
            else {
              *(undefined4 *)((long)chip + lVar6 + 0x4fa4) = 0;
              *(byte *)((long)chip + lVar6 + 0x4f9c) =
                   *(int *)((long)chip + lVar6 + 0x4fa8) == 0 ^ 3;
              uVar5 = 0;
            }
          }
        }
        else {
          if ((bVar8 & 2) != 0) {
            *(undefined1 *)((long)chip + lVar6 + 0x4fb9) = 4;
          }
          if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4fb9) == (bVar8 & 4))) {
            *(undefined4 *)((long)chip + lVar6 + 0x4fa4) = 0x3ff;
            uVar5 = 0x3ff;
          }
        }
        uVar11 = 0x200 - uVar5 & 0x3ff;
        if (*(byte *)((long)chip + lVar6 + 0x4fb9) == (bVar8 & 4)) {
          uVar11 = uVar5;
        }
        *(uint *)((long)chip + lVar6 + 0x4fac) = uVar11 + *(int *)((long)chip + lVar6 + 0x4fa0);
      }
      lVar6 = lVar6 + 0x50;
    } while ((int)lVar6 != 0x140);
  }
  else {
    pauVar1 = (undefined1 (*) [16])((long)chip + 0x4714);
    uVar20 = 0;
    uVar15 = extraout_RDX;
    do {
      *pauVar1 = (undefined1  [16])0x0;
      *(undefined8 *)((long)chip + 0x4724) = 0;
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + 0x47c0);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + 0x47ac), uVar15 = (ulong)uVar5,
            0x1ff < (int)uVar5)) && (bVar17 = *(byte *)((long)chip + lVar6 + 0x47a4), 1 < bVar17)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x479c) = 0;
            }
            else {
              pbVar2 = (byte *)((long)chip + lVar6 + 0x47c1);
              *pbVar2 = *pbVar2 ^ 4;
            }
            if (bVar17 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x4794) +
                  *(int *)((long)chip + lVar6 + 0x4784) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x47a4) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x47ac) = 0;
                *(byte *)((long)chip + lVar6 + 0x47a4) =
                     *(int *)((long)chip + lVar6 + 0x47b0) == 0 ^ 3;
                uVar15 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x47c1) = 4;
            }
            if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x47c1) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x47ac) = 0x3ff;
              uVar15 = 0x3ff;
            }
          }
          uVar5 = 0x200 - (uint)uVar15 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x47c1) == (bVar8 & 4)) {
            uVar5 = (uint)uVar15;
          }
          *(uint *)((long)chip + lVar6 + 0x47b4) = uVar5 + *(int *)((long)chip + lVar6 + 0x47a8);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + 0x4958);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + 0x4944), uVar15 = (ulong)uVar5,
            0x1ff < (int)uVar5)) && (bVar17 = *(byte *)((long)chip + lVar6 + 0x493c), 1 < bVar17)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x4934) = 0;
            }
            else {
              pbVar2 = (byte *)((long)chip + lVar6 + 0x4959);
              *pbVar2 = *pbVar2 ^ 4;
            }
            if (bVar17 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x492c) +
                  *(int *)((long)chip + lVar6 + 0x491c) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x493c) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x4944) = 0;
                *(byte *)((long)chip + lVar6 + 0x493c) =
                     *(int *)((long)chip + lVar6 + 0x4948) == 0 ^ 3;
                uVar15 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x4959) = 4;
            }
            if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4959) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x4944) = 0x3ff;
              uVar15 = 0x3ff;
            }
          }
          uVar5 = 0x200 - (uint)uVar15 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x4959) == (bVar8 & 4)) {
            uVar5 = (uint)uVar15;
          }
          *(uint *)((long)chip + lVar6 + 0x494c) = uVar5 + *(int *)((long)chip + lVar6 + 0x4940);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + 0x4af0);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + 0x4adc), uVar15 = (ulong)uVar5,
            0x1ff < (int)uVar5)) && (bVar17 = *(byte *)((long)chip + lVar6 + 0x4ad4), 1 < bVar17)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x4acc) = 0;
            }
            else {
              pbVar2 = (byte *)((long)chip + lVar6 + 0x4af1);
              *pbVar2 = *pbVar2 ^ 4;
            }
            if (bVar17 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x4ac4) +
                  *(int *)((long)chip + lVar6 + 0x4ab4) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x4ad4) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x4adc) = 0;
                *(byte *)((long)chip + lVar6 + 0x4ad4) =
                     *(int *)((long)chip + lVar6 + 0x4ae0) == 0 ^ 3;
                uVar15 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x4af1) = 4;
            }
            if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4af1) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x4adc) = 0x3ff;
              uVar15 = 0x3ff;
            }
          }
          uVar5 = 0x200 - (uint)uVar15 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x4af1) == (bVar8 & 4)) {
            uVar5 = (uint)uVar15;
          }
          *(uint *)((long)chip + lVar6 + 0x4ae4) = uVar5 + *(int *)((long)chip + lVar6 + 0x4ad8);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + 0x4c88);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + 0x4c74), uVar15 = (ulong)uVar5,
            0x1ff < (int)uVar5)) && (bVar17 = *(byte *)((long)chip + lVar6 + 0x4c6c), 1 < bVar17)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x4c64) = 0;
            }
            else {
              pbVar2 = (byte *)((long)chip + lVar6 + 0x4c89);
              *pbVar2 = *pbVar2 ^ 4;
            }
            if (bVar17 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x4c5c) +
                  *(int *)((long)chip + lVar6 + 0x4c4c) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x4c6c) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x4c74) = 0;
                *(byte *)((long)chip + lVar6 + 0x4c6c) =
                     *(int *)((long)chip + lVar6 + 0x4c78) == 0 ^ 3;
                uVar15 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x4c89) = 4;
            }
            if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4c89) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x4c74) = 0x3ff;
              uVar15 = 0x3ff;
            }
          }
          uVar5 = 0x200 - (uint)uVar15 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x4c89) == (bVar8 & 4)) {
            uVar5 = (uint)uVar15;
          }
          *(uint *)((long)chip + lVar6 + 0x4c7c) = uVar5 + *(int *)((long)chip + lVar6 + 0x4c70);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + 20000);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + 0x4e0c), uVar15 = (ulong)uVar5,
            0x1ff < (int)uVar5)) && (bVar17 = *(byte *)((long)chip + lVar6 + 0x4e04), 1 < bVar17)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x4dfc) = 0;
            }
            else {
              pbVar2 = (byte *)((long)chip + lVar6 + 0x4e21);
              *pbVar2 = *pbVar2 ^ 4;
            }
            if (bVar17 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x4df4) +
                  *(int *)((long)chip + lVar6 + 0x4de4) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x4e04) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x4e0c) = 0;
                *(byte *)((long)chip + lVar6 + 0x4e04) =
                     *(int *)((long)chip + lVar6 + 0x4e10) == 0 ^ 3;
                uVar15 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x4e21) = 4;
            }
            if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4e21) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x4e0c) = 0x3ff;
              uVar15 = 0x3ff;
            }
          }
          uVar5 = 0x200 - (uint)uVar15 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x4e21) == (bVar8 & 4)) {
            uVar5 = (uint)uVar15;
          }
          *(uint *)((long)chip + lVar6 + 0x4e14) = uVar5 + *(int *)((long)chip + lVar6 + 0x4e08);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      lVar6 = 0;
      do {
        bVar8 = *(byte *)((long)chip + lVar6 + 0x4fb8);
        if ((((bVar8 & 8) != 0) &&
            (uVar5 = *(uint *)((long)chip + lVar6 + 0x4fa4), uVar15 = (ulong)uVar5,
            0x1ff < (int)uVar5)) && (bVar17 = *(byte *)((long)chip + lVar6 + 0x4f9c), 1 < bVar17)) {
          if ((bVar8 & 1) == 0) {
            if ((bVar8 & 2) == 0) {
              *(undefined4 *)((long)chip + lVar6 + 0x4f94) = 0;
            }
            else {
              pbVar2 = (byte *)((long)chip + lVar6 + 0x4fb9);
              *pbVar2 = *pbVar2 ^ 4;
            }
            if (bVar17 != 4) {
              if ((uint)*(byte *)((long)chip + lVar6 + 0x4f8c) +
                  *(int *)((long)chip + lVar6 + 0x4f7c) < 0x5e) {
                *(undefined1 *)((long)chip + lVar6 + 0x4f9c) = 4;
              }
              else {
                *(undefined4 *)((long)chip + lVar6 + 0x4fa4) = 0;
                *(byte *)((long)chip + lVar6 + 0x4f9c) =
                     *(int *)((long)chip + lVar6 + 0x4fa8) == 0 ^ 3;
                uVar15 = 0;
              }
            }
          }
          else {
            if ((bVar8 & 2) != 0) {
              *(undefined1 *)((long)chip + lVar6 + 0x4fb9) = 4;
            }
            if ((bVar17 != 4) && (*(byte *)((long)chip + lVar6 + 0x4fb9) == (bVar8 & 4))) {
              *(undefined4 *)((long)chip + lVar6 + 0x4fa4) = 0x3ff;
              uVar15 = 0x3ff;
            }
          }
          uVar5 = 0x200 - (uint)uVar15 & 0x3ff;
          if (*(byte *)((long)chip + lVar6 + 0x4fb9) == (bVar8 & 4)) {
            uVar5 = (uint)uVar15;
          }
          *(uint *)((long)chip + lVar6 + 0x4fac) = uVar5 + *(int *)((long)chip + lVar6 + 0x4fa0);
        }
        lVar6 = lVar6 + 0x50;
      } while ((int)lVar6 != 0x140);
      if (*(char *)((long)chip + 0x510a) == '\0') {
        chan_calc(OPN,CH,(int)uVar15);
        chan_calc(OPN,CH_00,chnum);
        chan_calc(OPN,CH_01,chnum_00);
        chan_calc(OPN,CH_02,chnum_01);
        chan_calc(OPN,CH_03,chnum_02);
        if (*(char *)((long)chip + 0x5109) == '\0') {
          chan_calc(OPN,CH_04,chnum_03);
        }
        else {
          **(int **)((long)chip + 0x50d8) = **(int **)((long)chip + 0x50d8) + iVar4;
        }
      }
      else {
        *(ulong *)((long)chip + 0x4714) = CONCAT44(iVar4,iVar4);
        *(ulong *)((long)chip + 0x471c) = CONCAT44(iVar4,iVar4);
        *(int *)((long)chip + 0x4728) = iVar4;
      }
      uVar5 = *(uint *)((long)chip + 0x46f8);
      if (uVar5 != 0) {
        uVar11 = *(int *)((long)chip + 0x46f0) + *(int *)((long)chip + 0x46f4);
        *(uint *)((long)chip + 0x46f0) = uVar11;
        if (uVar5 <= uVar11) {
          bVar8 = *(byte *)((long)chip + 0x46ec);
          do {
            uVar11 = uVar11 - uVar5;
            bVar17 = bVar8 + 1;
            bVar8 = bVar17 & 0x7f;
          } while (uVar5 <= uVar11);
          uVar12 = (uint)(byte)(bVar17 * '\x02');
          uVar5 = uVar12 & 0x7e;
          if (bVar8 < 0x40) {
            uVar5 = uVar12 ^ 0x7e;
          }
          *(uint *)((long)chip + 0x46fc) = uVar5;
          *(uint *)((long)chip + 0x46f0) = uVar11;
          *(byte *)((long)chip + 0x46ec) = bVar8;
          *(uint *)((long)chip + 0x4700) = (uint)(bVar8 >> 2);
        }
      }
      uVar5 = *(uint *)((long)chip + 0x6e4);
      uVar11 = *(int *)((long)chip + 0x6dc) + *(int *)((long)chip + 0x6e0);
      *(uint *)((long)chip + 0x6dc) = uVar11;
      if (uVar5 <= uVar11) {
        do {
          *(uint *)((long)chip + 0x6dc) = uVar11 - uVar5;
          *(int *)((long)chip + 0x6d8) = *(int *)((long)chip + 0x6d8) + 1;
          advance_eg_channel(OPN,(FM_SLOT *)CH);
          advance_eg_channel(OPN,(FM_SLOT *)CH_00);
          advance_eg_channel(OPN,(FM_SLOT *)CH_01);
          advance_eg_channel(OPN,(FM_SLOT *)CH_02);
          advance_eg_channel(OPN,(FM_SLOT *)CH_03);
          advance_eg_channel(OPN,(FM_SLOT *)CH_04);
          uVar11 = *(uint *)((long)chip + 0x6dc);
          uVar5 = *(uint *)((long)chip + 0x6e4);
        } while (uVar5 <= uVar11);
      }
      uVar5 = *(uint *)*pauVar1;
      uVar11 = 0x1fff;
      if ((0x1fff < (int)uVar5) || (uVar11 = 0xffffe000, (int)uVar5 < -0x2000)) {
        uVar5 = uVar11;
        *(uint *)*pauVar1 = uVar5;
      }
      uVar11 = *(uint *)((long)chip + 0x4718);
      uVar12 = 0x1fff;
      if ((0x1fff < (int)uVar11) || (uVar12 = 0xffffe000, (int)uVar11 < -0x2000)) {
        uVar11 = uVar12;
        *(uint *)((long)chip + 0x4718) = uVar11;
      }
      uVar12 = *(uint *)((long)chip + 0x471c);
      uVar13 = 0x1fff;
      if ((0x1fff < (int)uVar12) || (uVar13 = 0xffffe000, (int)uVar12 < -0x2000)) {
        uVar12 = uVar13;
        *(uint *)((long)chip + 0x471c) = uVar12;
      }
      uVar13 = *(uint *)((long)chip + 0x4720);
      uVar3 = 0x1fff;
      if ((0x1fff < (int)uVar13) || (uVar3 = 0xffffe000, (int)uVar13 < -0x2000)) {
        uVar13 = uVar3;
        *(uint *)((long)chip + 0x4720) = uVar13;
      }
      uVar3 = *(uint *)((long)chip + 0x4724);
      uVar18 = 0x1fff;
      if ((0x1fff < (int)uVar3) || (uVar18 = 0xffffe000, (int)uVar3 < -0x2000)) {
        *(uint *)((long)chip + 0x4724) = uVar18;
        uVar3 = uVar18;
      }
      uVar18 = *(uint *)((long)chip + 0x4728);
      uVar21 = 0x1fff;
      if ((0x1fff < (int)uVar18) || (uVar21 = 0xffffe000, (int)uVar18 < -0x2000)) {
        uVar18 = uVar21;
        *(uint *)((long)chip + 0x4728) = uVar18;
      }
      uVar14 = (uVar13 & *(uint *)((long)chip + 0x6c4)) + (uVar12 & *(uint *)((long)chip + 0x6bc)) +
               (uVar11 & *(uint *)((long)chip + 0x6b4)) + (uVar5 & *(uint *)((long)chip + 0x6ac));
      uVar21 = iVar4 * 2;
      if (*(char *)((long)chip + 0x510a) == '\0') {
        uVar14 = uVar14 + (uVar3 & *(uint *)((long)chip + 0x6cc));
        uVar21 = *(uint *)((long)chip + 0x6c8) & uVar3;
      }
      uVar15 = (ulong)uVar14;
      iVar9 = (*(uint *)((long)chip + 0x6d0) & uVar18) + uVar21 +
              (*(uint *)((long)chip + 0x6b8) & uVar12) + (*(uint *)((long)chip + 0x6c0) & uVar13) +
              (*(uint *)((long)chip + 0x6b0) & uVar11) + (*(uint *)((long)chip + 0x6a8) & uVar5);
      iVar19 = (uVar18 & *(uint *)((long)chip + 0x6d4)) + uVar14;
      bVar8 = *(byte *)((long)chip + 0x5111);
      if (bVar8 == 0) {
        *(int *)((long)chip + 0x5114) = iVar9;
        *(int *)((long)chip + 0x5118) = iVar19;
      }
      else {
        if ((bVar8 & 1) != 0) {
          *(int *)((long)chip + 0x5114) = iVar9;
        }
        if ((bVar8 & 2) != 0) {
          *(int *)((long)chip + 0x5118) = iVar19;
        }
        *(byte *)((long)chip + 0x5111) = bVar8 ^ 3;
        iVar9 = *(int *)((long)chip + 0x5114);
      }
      local_78[uVar20] = iVar9;
      local_70[uVar20] = *(DEV_SMPL *)((long)chip + 0x5118);
      *(char *)((long)chip + 0x69c) = *(char *)((long)chip + 0x69c) << 1;
      iVar9 = *(int *)((long)chip + 0x23c);
      if (((iVar9 != 0) && (*(long *)((long)chip + 0x648) == 0)) &&
         (iVar10 = (int)(*(double *)((long)chip + 0x220) * 4096.0), iVar19 = iVar9 - iVar10,
         *(int *)((long)chip + 0x23c) = iVar19, iVar19 == 0 || iVar9 < iVar10)) {
        if ((*(byte *)((long)chip + 0x230) & 4) == 0) {
LAB_00131af7:
          iVar9 = 0x400 - *(int *)((long)chip + 0x238);
        }
        else {
          bVar8 = *(byte *)((long)chip + 0x22f) | 1;
          *(byte *)((long)chip + 0x22f) = bVar8;
          if ((*(char *)((long)chip + 0x22d) != '\0') ||
             ((*(byte *)((long)chip + 0x22e) & bVar8) == 0)) goto LAB_00131af7;
          *(undefined1 *)((long)chip + 0x22d) = 1;
          if (*(code **)((long)chip + 0x650) == (code *)0x0) goto LAB_00131af7;
          (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
          iVar9 = 0x400 - *(int *)((long)chip + 0x238);
          *(int *)((long)chip + 0x23c) = iVar9;
          if (*(code **)((long)chip + 0x648) != (code *)0x0) {
            (**(code **)((long)chip + 0x648))
                      (*(undefined8 *)((long)chip + 0x210),0,iVar9 * *(int *)((long)chip + 0x228),
                       *(undefined4 *)((long)chip + 0x218));
            iVar9 = *(int *)((long)chip + 0x23c);
          }
        }
        uVar15 = (ulong)(uint)(iVar9 << 0xc);
        *(int *)((long)chip + 0x23c) = iVar9 << 0xc;
        if ((*(uint *)((long)chip + 0x230) & 0xc0) == 0x80) {
          CSMKeyControl(OPN,CH_01);
          uVar15 = extraout_RDX_00;
        }
      }
      if ((*(byte *)((long)chip + 0x69c) & 2) != 0) {
        if ((*(char *)((long)chip + 0x4af2) == '\0') && (1 < *(byte *)((long)chip + 0x4ad4))) {
          *(undefined1 *)((long)chip + 0x4ad4) = 1;
          if ((*(byte *)((long)chip + 0x4af0) & 8) != 0) {
            uVar15 = (ulong)*(byte *)((long)chip + 0x4af1);
            uVar5 = *(uint *)((long)chip + 0x4adc);
            if ((*(byte *)((long)chip + 0x4af0) & 4) != *(byte *)((long)chip + 0x4af1)) {
              uVar5 = 0x200 - uVar5 & 0x3ff;
              *(uint *)((long)chip + 0x4adc) = uVar5;
            }
            if (0x1ff < (int)uVar5) {
              *(undefined4 *)((long)chip + 0x4adc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4ad4) = 0;
              uVar5 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4ae4) = uVar5 + *(int *)((long)chip + 0x4ad8);
          }
        }
        if ((*(char *)((long)chip + 0x4b92) == '\0') && (1 < *(byte *)((long)chip + 0x4b74))) {
          *(undefined1 *)((long)chip + 0x4b74) = 1;
          if ((*(byte *)((long)chip + 0x4b90) & 8) != 0) {
            uVar15 = (ulong)*(byte *)((long)chip + 0x4b91);
            uVar5 = *(uint *)((long)chip + 0x4b7c);
            if ((*(byte *)((long)chip + 0x4b90) & 4) != *(byte *)((long)chip + 0x4b91)) {
              uVar5 = 0x200 - uVar5 & 0x3ff;
              *(uint *)((long)chip + 0x4b7c) = uVar5;
            }
            if (0x1ff < (int)uVar5) {
              *(undefined4 *)((long)chip + 0x4b7c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b74) = 0;
              uVar5 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4b84) = uVar5 + *(int *)((long)chip + 0x4b78);
          }
        }
        if ((*(char *)((long)chip + 0x4b42) == '\0') && (1 < *(byte *)((long)chip + 0x4b24))) {
          *(undefined1 *)((long)chip + 0x4b24) = 1;
          if ((*(byte *)((long)chip + 0x4b40) & 8) != 0) {
            uVar15 = (ulong)*(byte *)((long)chip + 0x4b41);
            uVar5 = *(uint *)((long)chip + 0x4b2c);
            if ((*(byte *)((long)chip + 0x4b40) & 4) != *(byte *)((long)chip + 0x4b41)) {
              uVar5 = 0x200 - uVar5 & 0x3ff;
              *(uint *)((long)chip + 0x4b2c) = uVar5;
            }
            if (0x1ff < (int)uVar5) {
              *(undefined4 *)((long)chip + 0x4b2c) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4b24) = 0;
              uVar5 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4b34) = uVar5 + *(int *)((long)chip + 0x4b28);
          }
        }
        if ((*(char *)((long)chip + 0x4be2) == '\0') && (1 < *(byte *)((long)chip + 0x4bc4))) {
          *(undefined1 *)((long)chip + 0x4bc4) = 1;
          if ((*(byte *)((long)chip + 0x4be0) & 8) != 0) {
            uVar15 = (ulong)*(byte *)((long)chip + 0x4be1);
            uVar5 = *(uint *)((long)chip + 0x4bcc);
            if ((*(byte *)((long)chip + 0x4be0) & 4) != *(byte *)((long)chip + 0x4be1)) {
              uVar5 = 0x200 - uVar5 & 0x3ff;
              *(uint *)((long)chip + 0x4bcc) = uVar5;
            }
            if (0x1ff < (int)uVar5) {
              *(undefined4 *)((long)chip + 0x4bcc) = 0x3ff;
              *(undefined1 *)((long)chip + 0x4bc4) = 0;
              uVar5 = 0x3ff;
            }
            *(uint *)((long)chip + 0x4bd4) = uVar5 + *(int *)((long)chip + 0x4bc8);
          }
        }
        *(undefined1 *)((long)chip + 0x69c) = 0;
      }
      uVar20 = uVar20 + 1;
    } while (uVar20 != length);
  }
  iVar4 = *(int *)((long)chip + 0x244);
  if (iVar4 == 0) {
    return;
  }
  if (*(long *)((long)chip + 0x648) != 0) {
    return;
  }
  iVar19 = (int)((double)length * *(double *)((long)chip + 0x220) * 4096.0);
  iVar9 = iVar4 - iVar19;
  *(int *)((long)chip + 0x244) = iVar9;
  if (iVar9 != 0 && iVar19 <= iVar4) {
    return;
  }
  if ((*(byte *)((long)chip + 0x230) & 8) != 0) {
    bVar8 = *(byte *)((long)chip + 0x22f) | 2;
    *(byte *)((long)chip + 0x22f) = bVar8;
    if ((*(char *)((long)chip + 0x22d) == '\0') && ((*(byte *)((long)chip + 0x22e) & bVar8) != 0)) {
      *(undefined1 *)((long)chip + 0x22d) = 1;
      if (*(code **)((long)chip + 0x650) != (code *)0x0) {
        (**(code **)((long)chip + 0x650))(*(undefined8 *)((long)chip + 0x210),1);
        iVar4 = (uint)*(byte *)((long)chip + 0x240) * -0x10 + 0x1000;
        *(int *)((long)chip + 0x244) = iVar4;
        if (*(code **)((long)chip + 0x648) != (code *)0x0) {
          (**(code **)((long)chip + 0x648))
                    (*(undefined8 *)((long)chip + 0x210),1,iVar4 * *(int *)((long)chip + 0x228),
                     *(undefined4 *)((long)chip + 0x218));
          iVar4 = *(int *)((long)chip + 0x244);
        }
        goto LAB_00131e55;
      }
    }
  }
  iVar4 = (uint)*(byte *)((long)chip + 0x240) * -0x10 + 0x1000;
LAB_00131e55:
  *(int *)((long)chip + 0x244) = iVar4 << 0xc;
  return;
}

Assistant:

void ym2612_update_one(void *chip, UINT32 length, DEV_SMPL **buffer)
{
	YM2612 *F2612 = (YM2612 *)chip;
	FM_OPN *OPN  = &F2612->OPN;
	INT32 *out_fm = OPN->out_fm;
	UINT32 i;
	DEV_SMPL  *bufL,*bufR;
	INT32 dacout;
	FM_CH   *cch[6];
	INT32 lt,rt;

	/* set buffer */
	if (buffer != NULL)
	{
		bufL = buffer[0];
		bufR = buffer[1];
	}
	else
	{
		// for internal 0-sample update
		bufL = bufR = NULL;
	}

	cch[0]   = &F2612->CH[0];
	cch[1]   = &F2612->CH[1];
	cch[2]   = &F2612->CH[2];
	cch[3]   = &F2612->CH[3];
	cch[4]   = &F2612->CH[4];
	cch[5]   = &F2612->CH[5];
	
	if (! F2612->MuteDAC)
		dacout = F2612->dacout << 5;    /* level unknown */
	else
		dacout = 0;

	/* refresh PG and EG */
	refresh_fc_eg_chan( OPN, cch[0] );
	refresh_fc_eg_chan( OPN, cch[1] );
	if( (OPN->ST.mode & 0xc0) )
	{
		/* 3SLOT MODE */
		if( cch[2]->SLOT[SLOT1].Incr==-1)
		{
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT1] , OPN->SL3.fc[1] , OPN->SL3.kcode[1] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT2] , OPN->SL3.fc[2] , OPN->SL3.kcode[2] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT3] , OPN->SL3.fc[0] , OPN->SL3.kcode[0] );
			refresh_fc_eg_slot(OPN, &cch[2]->SLOT[SLOT4] , cch[2]->fc , cch[2]->kcode );
		}
	}
	else
		refresh_fc_eg_chan( OPN, cch[2] );
	refresh_fc_eg_chan( OPN, cch[3] );
	refresh_fc_eg_chan( OPN, cch[4] );
	refresh_fc_eg_chan( OPN, cch[5] );
	if (! length)
	{
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);
	}


	/* buffering */
	for(i=0; i < length ; i++)
	{
		/* clear outputs */
		out_fm[0] = 0;
		out_fm[1] = 0;
		out_fm[2] = 0;
		out_fm[3] = 0;
		out_fm[4] = 0;
		out_fm[5] = 0;

		/* update SSG-EG output */
		update_ssg_eg_channel(&cch[0]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[1]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[2]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[3]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[4]->SLOT[SLOT1]);
		update_ssg_eg_channel(&cch[5]->SLOT[SLOT1]);

		/* calculate FM */
		if (! F2612->dac_test)
		{
			chan_calc(OPN, cch[0], 0 );
			chan_calc(OPN, cch[1], 1 );
			chan_calc(OPN, cch[2], 2 );
			chan_calc(OPN, cch[3], 3 );
			chan_calc(OPN, cch[4], 4 );
			if( F2612->dacen )
				*cch[5]->connect4 += dacout;
			else
				chan_calc(OPN, cch[5], 5 );
		}
		else
		{
			out_fm[0] = out_fm[1] = dacout;
			out_fm[2] = out_fm[3] = dacout;
			out_fm[5] = dacout;
		}

		/* advance LFO */
		advance_lfo(OPN);

		/* advance envelope generator */
		OPN->eg_timer += OPN->eg_timer_add;
		while (OPN->eg_timer >= OPN->eg_timer_overflow)
		{
			OPN->eg_timer -= OPN->eg_timer_overflow;
			OPN->eg_cnt++;

			advance_eg_channel(OPN, &cch[0]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[1]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[2]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[3]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[4]->SLOT[SLOT1]);
			advance_eg_channel(OPN, &cch[5]->SLOT[SLOT1]);
		}

		/* channels accumulator output clipping (14-bit max) */
		if (out_fm[0] > 8191) out_fm[0] = 8191;
		else if (out_fm[0] < -8192) out_fm[0] = -8192;
		if (out_fm[1] > 8191) out_fm[1] = 8191;
		else if (out_fm[1] < -8192) out_fm[1] = -8192;
		if (out_fm[2] > 8191) out_fm[2] = 8191;
		else if (out_fm[2] < -8192) out_fm[2] = -8192;
		if (out_fm[3] > 8191) out_fm[3] = 8191;
		else if (out_fm[3] < -8192) out_fm[3] = -8192;
		if (out_fm[4] > 8191) out_fm[4] = 8191;
		else if (out_fm[4] < -8192) out_fm[4] = -8192;
		if (out_fm[5] > 8191) out_fm[5] = 8191;
		else if (out_fm[5] < -8192) out_fm[5] = -8192;

		/* 6-channels mixing  */
		lt  = ((out_fm[0]>>0) & OPN->pan[0]);
		rt  = ((out_fm[0]>>0) & OPN->pan[1]);
		lt += ((out_fm[1]>>0) & OPN->pan[2]);
		rt += ((out_fm[1]>>0) & OPN->pan[3]);
		lt += ((out_fm[2]>>0) & OPN->pan[4]);
		rt += ((out_fm[2]>>0) & OPN->pan[5]);
		lt += ((out_fm[3]>>0) & OPN->pan[6]);
		rt += ((out_fm[3]>>0) & OPN->pan[7]);
		if (! F2612->dac_test)
		{
			lt += ((out_fm[4]>>0) & OPN->pan[8]);
			rt += ((out_fm[4]>>0) & OPN->pan[9]);
		}
		else
		{
			// DAC test mode ignores panning for channel 4
			lt += dacout;
			lt += dacout;
		}
		lt += ((out_fm[5]>>0) & OPN->pan[10]);
		rt += ((out_fm[5]>>0) & OPN->pan[11]);

		/* buffering */
		if (F2612->WaveOutMode)
		{
			if (F2612->WaveOutMode & 0x01)
				F2612->WaveL = lt;
			if (F2612->WaveOutMode & 0x02)
				F2612->WaveR = rt;
			F2612->WaveOutMode ^= 0x03;
		}
		else
		{
			F2612->WaveL = lt;
			F2612->WaveR = rt;
		}
		bufL[i] = F2612->WaveL;
		bufR[i] = F2612->WaveR;

		/* CSM mode: if CSM Key ON has occured, CSM Key OFF need to be sent       */
		/* only if Timer A does not overflow again (i.e CSM Key ON not set again) */
		OPN->SL3.key_csm <<= 1;

		/* timer A control */
		INTERNAL_TIMER_A( &OPN->ST , cch[2] )

		/* CSM Mode Key ON still disabled */
		if (OPN->SL3.key_csm & 2)
		{
			/* CSM Mode Key OFF (verified by Nemesis on real hardware) */
			FM_KEYOFF_CSM(cch[2],SLOT1);
			FM_KEYOFF_CSM(cch[2],SLOT2);
			FM_KEYOFF_CSM(cch[2],SLOT3);
			FM_KEYOFF_CSM(cch[2],SLOT4);
			OPN->SL3.key_csm = 0;
		}
	}

	/* timer B control */
	INTERNAL_TIMER_B(&OPN->ST,length)
}